

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.h
# Opt level: O2

void io::detail::parse_line<io::trim_chars<(char)32,(char)9>,io::no_quote_escape<(char)44>>
               (char *line,char **sorted_col,vector<int,_std::allocator<int>_> *col_order)

{
  undefined8 *__s;
  pointer_____offset_0x10___ *ppuVar1;
  ulong uVar2;
  char *local_48;
  char *col_end;
  char *col_begin;
  char *line_local;
  
  uVar2 = 0;
  col_begin = line;
  do {
    if ((ulong)((long)(col_order->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(col_order->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 2) <= uVar2) {
      if (col_begin == (char *)0x0) {
        return;
      }
      __s = (undefined8 *)__cxa_allocate_exception(0x210);
      memset(__s,0,0x210);
      *(undefined4 *)(__s + 0x41) = 0xffffffff;
      *__s = &PTR__exception_00122ae0;
      ppuVar1 = &error::too_many_columns::typeinfo;
LAB_00117747:
      __cxa_throw(__s,ppuVar1,std::exception::~exception);
    }
    if (col_begin == (char *)0x0) {
      __s = (undefined8 *)__cxa_allocate_exception(0x210);
      memset(__s,0,0x210);
      *(undefined4 *)(__s + 0x41) = 0xffffffff;
      *__s = &PTR__exception_00122ab0;
      ppuVar1 = &error::too_few_columns::typeinfo;
      goto LAB_00117747;
    }
    chop_next_column<io::no_quote_escape<(char)44>>(&col_begin,&col_end,&local_48);
    if ((col_order->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start[uVar2] != -1) {
      trim_chars<'_',_'\t'>::trim(&col_end,&local_48);
      sorted_col
      [(col_order->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_start[uVar2]] = col_end;
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

void parse_line(
                        char*line,
                        char**sorted_col,
                        const std::vector<int>&col_order
                ){
                        for(std::size_t i=0; i<col_order.size(); ++i){
                                if(line == nullptr)
                                        throw ::io::error::too_few_columns();
                                char*col_begin, *col_end;
                                chop_next_column<quote_policy>(line, col_begin, col_end);

                                if(col_order[i] != -1){
                                        trim_policy::trim(col_begin, col_end);
                                        quote_policy::unescape(col_begin, col_end);
                                                               
                                        sorted_col[col_order[i]] = col_begin;
                                }
                        }
                        if(line != nullptr)
                                throw ::io::error::too_many_columns();
                }